

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O1

void __thiscall
SimplexTimer::initialiseSimplexClocks(SimplexTimer *this,HighsTimerClock *simplex_timer_clock)

{
  HighsTimer *this_00;
  HighsInt HVar1;
  
  this_00 = simplex_timer_clock->timer_pointer_;
  std::vector<int,_std::allocator<int>_>::resize(&simplex_timer_clock->clock_,0x53);
  HVar1 = HighsTimer::clock_def(this_00,"Simplex total");
  *(simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Iz DSE Wt");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dual Phase 1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dual Phase 2");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Primal Phase 1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[4] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Primal Phase 2");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[5] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"GROUP1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[6] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"ITERATE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[7] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DUAL REBUILD");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[8] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRIMAL REBUILD");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[9] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZR");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"VERIFY");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRIMAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DEVEX_IZ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PIVOTS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"IZ_SIMPLEX_LP_DEF");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"ALLOC_SIMPLEX_ARRS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"IZ_SIMPLEX_CO_BD");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"SCALE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CRASH");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BASIS_CONDITION");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"MATRIX_SETUP");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"SET_NONBASICMOVE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DSE_IZ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"INVERT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PERM_WT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CORRECT_DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_PRIMAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COLLECT_PR_IFS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_PR_IFS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_DU_IFS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_DU_OBJ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"COMPUTE_PR_OBJ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"REPORT_REBUILD");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZR_DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZR1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZR2");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC_PRIMAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC_HYPER_IZ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC_HYPER_FEAS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC_HYPER_DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC_HYPER");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC0");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRICE_CHUZC1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC2");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC3");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4a0");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4a1");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4b");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4c");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4d");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC4e");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"CHUZC5");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DEVEX_WT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN_FEAS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN_FULL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRICE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRICE_FEAS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"PRICE_FULL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x41] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x42] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN_DSE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x43] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN_PSE");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x44] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN_MIX_PAR");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x45] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN_MIX_FINAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x46] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN_BFRT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x47] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_ROW");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x48] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_DUAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x49] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_DUAL_FEAS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_PRIMAL");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"DEVEX_IZ");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_DVX_WEIGHT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_DSE_WEIGHT");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_PIVOTS");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x4f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_FACTOR");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x50] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_MATRIX");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x51] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"UPDATE_ROW_EP");
  (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x52] = HVar1;
  return;
}

Assistant:

void initialiseSimplexClocks(HighsTimerClock& simplex_timer_clock) {
    HighsTimer* timer_pointer = simplex_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = simplex_timer_clock.clock_;
    clock.resize(SimplexNumClock);
    clock[SimplexTotalClock] = timer_pointer->clock_def("Simplex total");
    clock[SimplexIzDseWtClock] = timer_pointer->clock_def("Iz DSE Wt");
    clock[SimplexDualPhase1Clock] = timer_pointer->clock_def("Dual Phase 1");
    clock[SimplexDualPhase2Clock] = timer_pointer->clock_def("Dual Phase 2");
    clock[SimplexPrimalPhase1Clock] =
        timer_pointer->clock_def("Primal Phase 1");
    clock[SimplexPrimalPhase2Clock] =
        timer_pointer->clock_def("Primal Phase 2");
    clock[Group1Clock] = timer_pointer->clock_def("GROUP1");
    clock[IterateClock] = timer_pointer->clock_def("ITERATE");
    clock[IterateDualRebuildClock] = timer_pointer->clock_def("DUAL REBUILD");
    clock[IteratePrimalRebuildClock] =
        timer_pointer->clock_def("PRIMAL REBUILD");
    clock[IterateChuzrClock] = timer_pointer->clock_def("CHUZR");
    clock[IterateChuzcClock] = timer_pointer->clock_def("CHUZC");
    clock[IterateFtranClock] = timer_pointer->clock_def("FTRAN");
    clock[IterateVerifyClock] = timer_pointer->clock_def("VERIFY");
    clock[IterateDualClock] = timer_pointer->clock_def("DUAL");
    clock[IteratePrimalClock] = timer_pointer->clock_def("PRIMAL");
    clock[IterateDevexIzClock] = timer_pointer->clock_def("DEVEX_IZ");
    clock[IteratePivotsClock] = timer_pointer->clock_def("PIVOTS");
    clock[initialiseSimplexLpBasisAndFactorClock] =
        timer_pointer->clock_def("IZ_SIMPLEX_LP_DEF");
    clock[allocateSimplexArraysClock] =
        timer_pointer->clock_def("ALLOC_SIMPLEX_ARRS");
    clock[initialiseSimplexCostBoundsClock] =
        timer_pointer->clock_def("IZ_SIMPLEX_CO_BD");
    clock[ScaleClock] = timer_pointer->clock_def("SCALE");
    clock[CrashClock] = timer_pointer->clock_def("CRASH");
    clock[BasisConditionClock] = timer_pointer->clock_def("BASIS_CONDITION");
    clock[matrixSetupClock] = timer_pointer->clock_def("MATRIX_SETUP");
    clock[setNonbasicMoveClock] = timer_pointer->clock_def("SET_NONBASICMOVE");
    clock[DseIzClock] = timer_pointer->clock_def("DSE_IZ");
    clock[InvertClock] = timer_pointer->clock_def("INVERT");
    clock[PermWtClock] = timer_pointer->clock_def("PERM_WT");
    clock[ComputeDualClock] = timer_pointer->clock_def("COMPUTE_DUAL");
    clock[CorrectDualClock] = timer_pointer->clock_def("CORRECT_DUAL");
    clock[ComputePrimalClock] = timer_pointer->clock_def("COMPUTE_PRIMAL");
    clock[CollectPrIfsClock] = timer_pointer->clock_def("COLLECT_PR_IFS");
    clock[ComputePrIfsClock] = timer_pointer->clock_def("COMPUTE_PR_IFS");
    clock[ComputeDuIfsClock] = timer_pointer->clock_def("COMPUTE_DU_IFS");
    clock[ComputeDuObjClock] = timer_pointer->clock_def("COMPUTE_DU_OBJ");
    clock[ComputePrObjClock] = timer_pointer->clock_def("COMPUTE_PR_OBJ");
    clock[ReportRebuildClock] = timer_pointer->clock_def("REPORT_REBUILD");
    clock[ChuzrDualClock] = timer_pointer->clock_def("CHUZR_DUAL");
    clock[Chuzr1Clock] = timer_pointer->clock_def("CHUZR1");
    clock[Chuzr2Clock] = timer_pointer->clock_def("CHUZR2");
    clock[ChuzcPrimalClock] = timer_pointer->clock_def("CHUZC_PRIMAL");
    clock[ChuzcHyperInitialiselClock] =
        timer_pointer->clock_def("CHUZC_HYPER_IZ");
    clock[ChuzcHyperBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("CHUZC_HYPER_FEAS");
    clock[ChuzcHyperDualClock] = timer_pointer->clock_def("CHUZC_HYPER_DUAL");
    clock[ChuzcHyperClock] = timer_pointer->clock_def("CHUZC_HYPER");
    clock[Chuzc0Clock] = timer_pointer->clock_def("CHUZC0");
    clock[PriceChuzc1Clock] = timer_pointer->clock_def("PRICE_CHUZC1");
    clock[Chuzc1Clock] = timer_pointer->clock_def("CHUZC1");
    clock[Chuzc2Clock] = timer_pointer->clock_def("CHUZC2");
    clock[Chuzc3Clock] = timer_pointer->clock_def("CHUZC3");
    clock[Chuzc4Clock] = timer_pointer->clock_def("CHUZC4");
    clock[Chuzc4a0Clock] = timer_pointer->clock_def("CHUZC4a0");
    clock[Chuzc4a1Clock] = timer_pointer->clock_def("CHUZC4a1");
    clock[Chuzc4bClock] = timer_pointer->clock_def("CHUZC4b");
    clock[Chuzc4cClock] = timer_pointer->clock_def("CHUZC4c");
    clock[Chuzc4dClock] = timer_pointer->clock_def("CHUZC4d");
    clock[Chuzc4eClock] = timer_pointer->clock_def("CHUZC4e");
    clock[Chuzc5Clock] = timer_pointer->clock_def("CHUZC5");
    clock[DevexWtClock] = timer_pointer->clock_def("DEVEX_WT");
    clock[BtranClock] = timer_pointer->clock_def("BTRAN");
    clock[BtranBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("BTRAN_FEAS");
    clock[BtranFullClock] = timer_pointer->clock_def("BTRAN_FULL");
    clock[PriceClock] = timer_pointer->clock_def("PRICE");
    clock[PriceBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("PRICE_FEAS");
    clock[PriceFullClock] = timer_pointer->clock_def("PRICE_FULL");
    clock[FtranClock] = timer_pointer->clock_def("FTRAN");
    clock[FtranDseClock] = timer_pointer->clock_def("FTRAN_DSE");
    clock[BtranPseClock] = timer_pointer->clock_def("BTRAN_PSE");
    clock[FtranMixParClock] = timer_pointer->clock_def("FTRAN_MIX_PAR");
    clock[FtranMixFinalClock] = timer_pointer->clock_def("FTRAN_MIX_FINAL");
    clock[FtranBfrtClock] = timer_pointer->clock_def("FTRAN_BFRT");
    clock[UpdateRowClock] = timer_pointer->clock_def("UPDATE_ROW");
    clock[UpdateDualClock] = timer_pointer->clock_def("UPDATE_DUAL");
    clock[UpdateDualBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("UPDATE_DUAL_FEAS");
    clock[UpdatePrimalClock] = timer_pointer->clock_def("UPDATE_PRIMAL");
    clock[DevexIzClock] = timer_pointer->clock_def("DEVEX_IZ");
    clock[DevexUpdateWeightClock] =
        timer_pointer->clock_def("UPDATE_DVX_WEIGHT");
    clock[DseUpdateWeightClock] = timer_pointer->clock_def("UPDATE_DSE_WEIGHT");
    clock[UpdatePivotsClock] = timer_pointer->clock_def("UPDATE_PIVOTS");
    clock[UpdateFactorClock] = timer_pointer->clock_def("UPDATE_FACTOR");
    clock[UpdateMatrixClock] = timer_pointer->clock_def("UPDATE_MATRIX");
    clock[UpdateRowEpClock] = timer_pointer->clock_def("UPDATE_ROW_EP");
  }